

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::validateKTXorientation(ValidationContext *this,uint8_t *data,uint32_t size)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  char local_3a [2];
  ulong local_38;
  string_view value;
  ulong uVar5;
  
  this->foundKTXorientation = true;
  if ((size == 0) || (data[size - 1] != '\0')) {
    error<>(this,&Metadata::KTXorientationMissingNull);
    iVar3 = 0;
  }
  else {
    iVar3 = -1;
  }
  uVar4 = iVar3 + size;
  uVar5 = (ulong)uVar4;
  uVar2 = uVar4;
  value._M_len = uVar5;
  value._M_str = (char *)data;
  if (uVar4 != this->dimensionCount) {
    local_38 = uVar5;
    error<unsigned_long,unsigned_int&>
              (this,&Metadata::KTXorientationIncorrectDimension,&local_38,&this->dimensionCount);
    uVar2 = this->dimensionCount;
  }
  if (((uVar2 != 0 && uVar4 != 0) && (*data != 'l')) && (*data != 'r')) {
    local_38 = local_38 & 0xffffffff00000000;
    local_3a[1] = 0x72;
    local_3a[0] = 'l';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_38,(char *)data,local_3a + 1
               ,local_3a);
    uVar2 = this->dimensionCount;
  }
  if (((1 < uVar2 && 1 < uVar4) && (data[1] != 'd')) && (data[1] != 'u')) {
    local_38 = CONCAT44(local_38._4_4_,1);
    local_3a[1] = 100;
    local_3a[0] = 'u';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_38,(char *)(data + 1),
               local_3a + 1,local_3a);
    uVar2 = this->dimensionCount;
  }
  if (((2 < uVar4) && (2 < uVar2)) && ((data[2] != 'i' && (data[2] != 'o')))) {
    local_38 = CONCAT44(local_38._4_4_,2);
    local_3a[1] = 0x6f;
    local_3a[0] = 'i';
    error<int,char_const&,char,char>
              (this,&Metadata::KTXorientationInvalidValue,(int *)&local_38,(char *)(data + 2),
               local_3a + 1,local_3a);
  }
  if (this->checkGLTFBasisU == true) {
    __y._M_str = "rd";
    __y._M_len = 2;
    __x._M_str = (char *)data;
    __x._M_len = uVar5;
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      error<std::basic_string_view<char,std::char_traits<char>>const&>
                (this,&Metadata::KTXorientationInvalidGLTFBU,&value);
    }
  }
  return;
}

Assistant:

void ValidationContext::validateKTXorientation(const uint8_t* data, uint32_t size) {
    foundKTXorientation = true;

    const auto hasNull = size > 0 && data[size - 1] == '\0';
    if (!hasNull)
        error(Metadata::KTXorientationMissingNull);

    const auto value = std::string_view(reinterpret_cast<const char*>(data), hasNull ? size - 1 : size);

    if (value.size() != dimensionCount)
        error(Metadata::KTXorientationIncorrectDimension, value.size(), dimensionCount);

    if (value.size() > 0 && dimensionCount > 0 && value[0] != 'r' && value[0] != 'l')
        error(Metadata::KTXorientationInvalidValue, 0, value[0], 'r', 'l');

    if (value.size() > 1 && dimensionCount > 1 && value[1] != 'd' && value[1] != 'u')
        error(Metadata::KTXorientationInvalidValue, 1, value[1], 'd', 'u');

    if (value.size() > 2 && dimensionCount > 2 && value[2] != 'o' && value[2] != 'i')
        error(Metadata::KTXorientationInvalidValue, 2, value[2], 'o', 'i');

    if (checkGLTFBasisU && value != "rd")
        error(Metadata::KTXorientationInvalidGLTFBU, value);
}